

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::InteractionArgumentAliasing1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionArgumentAliasing1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  bool bVar1;
  pointer ppVar2;
  TestError *this_00;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  string verification;
  string function_use;
  string function_definition;
  string array_declaration;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_b0;
  iterator local_a8;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_a0;
  _supported_variable_types_map_const_iterator var_iterator;
  size_t var_type_index;
  bool test_compute;
  size_t num_var_types;
  test_var_type *var_types_set;
  undefined1 local_70 [8];
  string iteration_loop_start;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string iteration_loop_end;
  TestShaderType tested_shader_type_local;
  InteractionArgumentAliasing1<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  iteration_loop_end.field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,
             "                               }\n                           }\n                        }\n                    }\n                }\n            }\n        }\n    }\n"
             ,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,
             "    for (uint a = 0u; a < 2u; a++)\n    {\n        for (uint b = 0u; b < 2u; b++)\n        {\n            for (uint c = 0u; c < 2u; c++)\n            {\n                for (uint d = 0u; d < 2u; d++)\n                {\n                    for (uint e = 0u; e < 2u; e++)\n                    {\n                        for (uint f = 0u; f < 2u; f++)\n                        {\n                           for (uint g = 0u; g < 2u; g++)\n                           {\n                               for (uint h = 0u; h < 2u; h++)\n                               {\n"
             ,(allocator<char> *)((long)&var_types_set + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&var_types_set + 7));
  bVar3 = iteration_loop_end.field_2._12_4_ == 2;
  var_iterator._M_node = (_Base_ptr)0x0;
  while( true ) {
    if ((_Base_ptr)&DAT_00000004 < var_iterator._M_node) {
      std::__cxx11::string::~string((string *)local_70);
      std::__cxx11::string::~string((string *)local_38);
      return;
    }
    local_a8._M_node =
         (_Base_ptr)
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::find((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                 *)supported_variable_types_map,
                test_shader_compilation::var_types_set_gl + (long)var_iterator._M_node);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_a0,&local_a8);
    array_declaration.field_2._8_8_ =
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::end((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                *)supported_variable_types_map);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_b0,(iterator *)((long)&array_declaration.field_2 + 8));
    bVar1 = std::operator!=(&local_a0,&local_b0);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
             ::operator->(&local_a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&function_definition.field_2 + 8),&(ppVar2->second).type,
                   " z[2][2][2][2][2][2][2][2];\n\n");
    std::__cxx11::string::string((string *)(function_use.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(verification.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_138);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
             ::operator->(&local_a0);
    std::operator+(&local_178,"bool gfunc(",&(ppVar2->second).type);
    std::operator+(&local_158,&local_178," x[2][2][2][2][2][2][2][2], ");
    std::__cxx11::string::operator+=
              ((string *)(function_use.field_2._M_local_buf + 8),(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
             ::operator->(&local_a0);
    std::operator+(&local_198,&(ppVar2->second).type," y[2][2][2][2][2][2][2][2])\n");
    std::__cxx11::string::operator+=
              ((string *)(function_use.field_2._M_local_buf + 8),(string *)&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::operator+=((string *)(function_use.field_2._M_local_buf + 8),"{\n");
    std::operator+(&local_1b8,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    std::__cxx11::string::operator+=
              ((string *)(function_use.field_2._M_local_buf + 8),(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
             ::operator->(&local_a0);
    std::operator+(&local_1f8,"                               x[a][b][c][d][e][f][g][h] = ",
                   &(ppVar2->second).type);
    std::operator+(&local_1d8,&local_1f8,"(123);\n");
    std::__cxx11::string::operator+=
              ((string *)(function_use.field_2._M_local_buf + 8),(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::operator+(&local_218,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    std::__cxx11::string::operator+=
              ((string *)(function_use.field_2._M_local_buf + 8),(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::operator+=((string *)(function_use.field_2._M_local_buf + 8),"\n");
    std::operator+(&local_238,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    std::__cxx11::string::operator+=
              ((string *)(function_use.field_2._M_local_buf + 8),(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::operator+=
              ((string *)(function_use.field_2._M_local_buf + 8),
               "                                   if(y[a][b][c][d][e][f][g][h]");
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
             ::operator->(&local_a0);
    bVar1 = std::operator==(&(ppVar2->second).type,"mat4");
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)(function_use.field_2._M_local_buf + 8),"[0][0]");
      std::__cxx11::string::operator+=
                ((string *)(function_use.field_2._M_local_buf + 8)," != float");
    }
    else {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
               ::operator->(&local_a0);
      bVar1 = std::operator==(&(ppVar2->second).type,"dmat4");
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)(function_use.field_2._M_local_buf + 8),"[0][0]")
        ;
        std::__cxx11::string::operator+=
                  ((string *)(function_use.field_2._M_local_buf + 8)," != double");
      }
      else {
        std::__cxx11::string::operator+=((string *)(function_use.field_2._M_local_buf + 8)," != ");
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
                 ::operator->(&local_a0);
        std::__cxx11::string::operator+=
                  ((string *)(function_use.field_2._M_local_buf + 8),(string *)&ppVar2->second);
      }
    }
    std::__cxx11::string::operator+=
              ((string *)(function_use.field_2._M_local_buf + 8),
               "(((a*128u)+(b*64u)+(c*32u)+(d*16u)+(e*8u)+(f*4u)+(g*2u)+h))) {return false;}\n");
    std::operator+(&local_258,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    std::__cxx11::string::operator+=
              ((string *)(function_use.field_2._M_local_buf + 8),(string *)&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::operator+=
              ((string *)(function_use.field_2._M_local_buf + 8),"  return true;\n");
    std::__cxx11::string::operator+=((string *)(function_use.field_2._M_local_buf + 8),"}");
    std::operator+(&local_278,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&function_definition.field_2 + 8));
    std::__cxx11::string::operator+=
              ((string *)(verification.field_2._M_local_buf + 8),(string *)&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::operator+(&local_298,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    std::__cxx11::string::operator+=
              ((string *)(verification.field_2._M_local_buf + 8),(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::operator+=
              ((string *)(verification.field_2._M_local_buf + 8),
               "                                   z[a][b][c][d][e][f][g][h] = ");
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
             ::operator->(&local_a0);
    std::__cxx11::string::operator+=
              ((string *)(verification.field_2._M_local_buf + 8),(string *)&ppVar2->second);
    std::__cxx11::string::operator+=
              ((string *)(verification.field_2._M_local_buf + 8),
               "(((a*128u)+(b*64u)+(c*32u)+(d*16u)+(e*8u)+(f*4u)+(g*2u)+h));\n");
    std::operator+(&local_2b8,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    std::__cxx11::string::operator+=
              ((string *)(verification.field_2._M_local_buf + 8),(string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::operator+=((string *)local_138,"    float result = 0.0;\n");
    std::__cxx11::string::operator+=((string *)local_138,"    if(gfunc(z, z) == true)\n");
    std::__cxx11::string::operator+=((string *)local_138,"    {\n");
    std::__cxx11::string::operator+=((string *)local_138,"        result = 1.0;\n\n");
    std::__cxx11::string::operator+=((string *)local_138,"    }\n");
    std::__cxx11::string::operator+=((string *)local_138,"    else\n");
    std::__cxx11::string::operator+=((string *)local_138,"    {\n");
    std::__cxx11::string::operator+=((string *)local_138,"        result = 0.0;\n\n");
    std::__cxx11::string::operator+=((string *)local_138,"    }\n");
    if (bVar3) {
      InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::execute_dispatch_test
                (&this->super_InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>,
                 iteration_loop_end.field_2._12_4_,(string *)((long)&function_use.field_2 + 8),
                 (string *)((long)&verification.field_2 + 8),(string *)local_138);
    }
    else {
      InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::execute_draw_test
                (&this->super_InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>,
                 iteration_loop_end.field_2._12_4_,(string *)((long)&function_use.field_2 + 8),
                 (string *)((long)&verification.field_2 + 8),(string *)local_138);
    }
    (*(this->super_InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>).
      super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.super_TestCase.super_TestNode.
      _vptr_TestNode[5])();
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string((string *)(verification.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(function_use.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(function_definition.field_2._M_local_buf + 8));
    var_iterator._M_node = (_Base_ptr)((long)&(var_iterator._M_node)->_M_color + 1);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x1548);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void InteractionArgumentAliasing1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_INT, VAR_TYPE_FLOAT, VAR_TYPE_MAT4 };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_INT, VAR_TYPE_FLOAT, VAR_TYPE_MAT4,
															 VAR_TYPE_DOUBLE, VAR_TYPE_DMAT4 };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string iteration_loop_end = "                               }\n"
										   "                           }\n"
										   "                        }\n"
										   "                    }\n"
										   "                }\n"
										   "            }\n"
										   "        }\n"
										   "    }\n";
	const std::string iteration_loop_start = "    for (uint a = 0u; a < 2u; a++)\n"
											 "    {\n"
											 "        for (uint b = 0u; b < 2u; b++)\n"
											 "        {\n"
											 "            for (uint c = 0u; c < 2u; c++)\n"
											 "            {\n"
											 "                for (uint d = 0u; d < 2u; d++)\n"
											 "                {\n"
											 "                    for (uint e = 0u; e < 2u; e++)\n"
											 "                    {\n"
											 "                        for (uint f = 0u; f < 2u; f++)\n"
											 "                        {\n"
											 "                           for (uint g = 0u; g < 2u; g++)\n"
											 "                           {\n"
											 "                               for (uint h = 0u; h < 2u; h++)\n"
											 "                               {\n";
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;
	const bool					test_compute  = (TestCaseBase<API>::COMPUTE_SHADER_TYPE == tested_shader_type);

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string array_declaration = var_iterator->second.type + " z[2][2][2][2][2][2][2][2];\n\n";

			std::string function_definition;
			std::string function_use;
			std::string verification;

			function_definition += "bool gfunc(" + var_iterator->second.type + " x[2][2][2][2][2][2][2][2], ";
			function_definition += var_iterator->second.type + " y[2][2][2][2][2][2][2][2])\n";
			function_definition += "{\n";
			function_definition += "    " + iteration_loop_start;
			function_definition +=
				"                               x[a][b][c][d][e][f][g][h] = " + var_iterator->second.type + "(123);\n";
			function_definition += "    " + iteration_loop_end;
			function_definition += "\n";
			function_definition += "    " + iteration_loop_start;
			function_definition += "                                   if(y[a][b][c][d][e][f][g][h]";
			if (var_iterator->second.type == "mat4") // mat4 comparison
			{
				function_definition += "[0][0]";
				function_definition += " != float";
			}
			else if (var_iterator->second.type == "dmat4") // dmat4 comparison
			{
				function_definition += "[0][0]";
				function_definition += " != double";
			}
			else
			{
				function_definition += " != ";
				function_definition += var_iterator->second.type;
			}
			function_definition += "(((a*128u)+(b*64u)+(c*32u)+(d*16u)+(e*8u)+(f*4u)+(g*2u)+h))) {return false;}\n";
			function_definition += "    " + iteration_loop_end;
			function_definition += "  return true;\n";
			function_definition += "}";

			function_use += "    " + array_declaration;
			function_use += "    " + iteration_loop_start;
			function_use += "                                   z[a][b][c][d][e][f][g][h] = ";
			function_use += var_iterator->second.type;
			function_use += "(((a*128u)+(b*64u)+(c*32u)+(d*16u)+(e*8u)+(f*4u)+(g*2u)+h));\n";
			function_use += "    " + iteration_loop_end;

			verification += "    float result = 0.0;\n";
			verification += "    if(gfunc(z, z) == true)\n";
			verification += "    {\n";
			verification += "        result = 1.0;\n\n";
			verification += "    }\n";
			verification += "    else\n";
			verification += "    {\n";
			verification += "        result = 0.0;\n\n";
			verification += "    }\n";

			if (false == test_compute)
			{
				this->execute_draw_test(tested_shader_type, function_definition, function_use, verification);
			}
			else
			{
				this->execute_dispatch_test(tested_shader_type, function_definition, function_use, verification);
			}

			/* Deallocate any resources used. */
			this->delete_objects();
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	}
}